

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O1

REF_STATUS
ref_inflate_rail_node
          (REF_GRID ref_grid,REF_DICT faceids,REF_INT node,REF_BOOL *in_rail,REF_INT *ind)

{
  REF_CELL ref_cell;
  uint uVar1;
  REF_BOOL RVar2;
  undefined8 uVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  REF_INT n_id;
  REF_INT ids [4];
  REF_INT local_54;
  uint *local_50;
  REF_INT local_48 [6];
  
  ref_cell = ref_grid->cell[3];
  iVar5 = 0;
  local_54 = 0;
  *in_rail = 0;
  *ind = -1;
  uVar1 = ref_cell_id_list_around(ref_cell,node,4,&local_54,local_48);
  if (uVar1 == 0) {
    local_50 = (uint *)in_rail;
    if (0 < local_54) {
      lVar6 = 0;
      iVar5 = 0;
      do {
        RVar2 = ref_dict_has_key(faceids,local_48[lVar6]);
        if (RVar2 != 0) {
          uVar1 = ref_dict_location(faceids,local_48[lVar6],ind);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                   ,0x240,"ref_inflate_rail_node",(ulong)uVar1,"faceid loc");
            return uVar1;
          }
          iVar5 = iVar5 + 1;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_54);
    }
    if (iVar5 < 1) {
      pcVar4 = "no tris active";
      uVar3 = 0x244;
    }
    else {
      if (iVar5 < 3) {
        *local_50 = (uint)(iVar5 != 1);
        if (iVar5 == 1) {
          return 0;
        }
        *ind = -1;
        return 0;
      }
      pcVar4 = "three or more tri actve";
      uVar3 = 0x245;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",uVar3
           ,"ref_inflate_rail_node",pcVar4);
    uVar1 = 1;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x23c
           ,"ref_inflate_rail_node",(ulong)uVar1,"ids");
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_inflate_rail_node(REF_GRID ref_grid,
                                                REF_DICT faceids, REF_INT node,
                                                REF_BOOL *in_rail,
                                                REF_INT *ind) {
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_INT max_id = 4, n_id = 0, ids[4], i, nactive;
  *in_rail = REF_FALSE;
  *ind = REF_EMPTY;
  RSS(ref_cell_id_list_around(tri, node, max_id, &n_id, ids), "ids");
  nactive = 0;
  for (i = 0; i < n_id; i++) {
    if (ref_dict_has_key(faceids, ids[i])) {
      RSS(ref_dict_location(faceids, ids[i], ind), "faceid loc");
      nactive++;
    }
  }
  RAS(nactive > 0, "no tris active");
  RAS(nactive < 3, "three or more tri actve");
  *in_rail = (nactive > 1);
  if (*in_rail) *ind = REF_EMPTY;
  return REF_SUCCESS;
}